

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigNumber.cpp
# Opt level: O2

BigNumber *
montgomery(BigNumber *__return_storage_ptr__,BigNumber *a,BigNumber *b,BigNumber *n,int r,
          BigNumber *v)

{
  bool bVar1;
  BigNumber t;
  BigNumber m;
  BigNumber s;
  BigNumber local_1b0;
  BigNumber local_190;
  BigNumber local_170;
  BigNumber local_150;
  BigNumber local_130;
  BigNumber local_110;
  BigNumber local_f0;
  BigNumber local_d0;
  BigNumber local_b0;
  BigNumber local_90;
  BigNumber local_70;
  BigNumber local_50;
  
  BigNumber::BigNumber(&local_50,a);
  BigNumber::BigNumber(&local_90,b);
  operator*(&local_70,&local_50,&local_90);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_90);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_50);
  partial_multiplication(&local_1b0,&local_70,v,r);
  BigNumber::m_mask(&local_1b0,r);
  BigNumber::BigNumber(&local_d0,&local_70);
  BigNumber::BigNumber(&local_110,&local_1b0);
  BigNumber::BigNumber(&local_130,n);
  operator*(&local_f0,&local_110,&local_130);
  operator+(&local_b0,&local_d0,&local_f0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_f0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_130);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_110);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_d0);
  BigNumber::BigNumber(__return_storage_ptr__,&local_b0);
  BigNumber::operator<<(__return_storage_ptr__,r);
  bVar1 = operator>=(__return_storage_ptr__,n);
  if (bVar1) {
    BigNumber::BigNumber(&local_170,__return_storage_ptr__);
    BigNumber::BigNumber(&local_190,n);
    operator-(&local_150,&local_170,&local_190);
    BigNumber::operator=(__return_storage_ptr__,&local_150);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_150);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_190);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_170);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_b0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1b0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

BigNumber montgomery(BigNumber &a, BigNumber &b, BigNumber &n, int r, BigNumber &v){

//    clock_t t1, t2;
//    static clock_t t_tmp;
//    static unsigned int cmp = 0;
//    t1 = clock();

    BigNumber s = a*b;
    //BigNumber t = s*v;
    BigNumber t = partial_multiplication(s, v, r);
    t.m_mask(r);
    BigNumber m = s + t*n;
    BigNumber u = m;

    u << r;
    if(u >= n){
        u = u - n;
    }
//    t2 = clock();
//    t_tmp += (t2 - t1);
//    cmp += 1;
//    cout << " Montgomery : " << t_tmp/(float)cmp << endl;
    return u;

}